

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

size_t encoder_nop_read(char *buffer,size_t size,_Bool ateof,curl_mimepart *part)

{
  ulong uVar1;
  size_t insize;
  mime_encoder_state *st;
  curl_mimepart *part_local;
  size_t sStack_18;
  _Bool ateof_local;
  size_t size_local;
  char *buffer_local;
  
  uVar1 = (part->encstate).bufend - (part->encstate).bufbeg;
  sStack_18 = size;
  if (uVar1 < size) {
    sStack_18 = uVar1;
  }
  if (sStack_18 != 0) {
    memcpy(buffer,(part->encstate).buf,sStack_18);
  }
  (part->encstate).bufbeg = sStack_18 + (part->encstate).bufbeg;
  return sStack_18;
}

Assistant:

static size_t encoder_nop_read(char *buffer, size_t size, bool ateof,
                               curl_mimepart *part)
{
  mime_encoder_state *st = &part->encstate;
  size_t insize = st->bufend - st->bufbeg;

  (void) ateof;

  if(size > insize)
    size = insize;
  if(size)
    memcpy(buffer, st->buf, size);
  st->bufbeg += size;
  return size;
}